

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cc
# Opt level: O3

int strlcpy_int(char *dst,char *src,int dst_size)

{
  size_t sVar1;
  ulong dst_size_00;
  
  dst_size_00 = (ulong)(uint)dst_size;
  if (dst_size < 1) {
    dst_size_00 = 0;
  }
  sVar1 = OPENSSL_strlcpy(dst,src,dst_size_00);
  if ((sVar1 & 0xffffffff80000000) != 0) {
    ERR_put_error(8,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/obj/obj.cc"
                  ,0x180);
    sVar1 = 0xffffffff;
  }
  return (int)sVar1;
}

Assistant:

static int strlcpy_int(char *dst, const char *src, int dst_size) {
  size_t ret = OPENSSL_strlcpy(dst, src, dst_size < 0 ? 0 : (size_t)dst_size);
  if (ret > INT_MAX) {
    OPENSSL_PUT_ERROR(OBJ, ERR_R_OVERFLOW);
    return -1;
  }
  return (int)ret;
}